

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateParsingCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  ImmutableMessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "$type$.Builder subBuilder = null;\nif ($is_field_present_message$) {\n  subBuilder = $name$_.toBuilder();\n}\n"
                    );
  TVar1 = GetType(this->descriptor_);
  if (TVar1 == TYPE_GROUP) {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_ = input.readGroup($number$, $type$.$get_parser$,\n    extensionRegistry);\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_ = input.readMessage($type$.$get_parser$, extensionRegistry);\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "if (subBuilder != null) {\n  subBuilder.mergeFrom($name$_);\n  $name$_ = subBuilder.buildPartial();\n}\n$set_has_field_bit_message$\n"
                    );
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "$type$.Builder subBuilder = null;\n"
    "if ($is_field_present_message$) {\n"
    "  subBuilder = $name$_.toBuilder();\n"
    "}\n");

  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
      "$name$_ = input.readGroup($number$, $type$.$get_parser$,\n"
      "    extensionRegistry);\n");
  } else {
    printer->Print(variables_,
      "$name$_ = input.readMessage($type$.$get_parser$, extensionRegistry);\n");
  }

  printer->Print(variables_,
    "if (subBuilder != null) {\n"
    "  subBuilder.mergeFrom($name$_);\n"
    "  $name$_ = subBuilder.buildPartial();\n"
    "}\n"
    "$set_has_field_bit_message$\n");
}